

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall pugi::xml_node::prepend_attribute(xml_node *this,char_t *name_)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_memory_page *in_RAX;
  xml_attribute_struct *pxVar5;
  uint uVar6;
  xml_attribute a;
  xml_attribute local_18;
  
  pxVar2 = this->_root;
  if (pxVar2 == (xml_node_struct *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)pxVar2->header & 0xf;
  }
  if ((uVar6 == 7) || (uVar6 == 2)) {
    this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
    uVar1 = this_00->_busy_size + 0x28;
    if (uVar1 < 0x7fd9) {
      local_18._attr = (xml_attribute_struct *)this_00->_root;
      pxVar5 = (xml_attribute_struct *)
               ((long)&((xml_memory_page *)local_18._attr)[1].allocator + this_00->_busy_size);
      this_00->_busy_size = uVar1;
    }
    else {
      local_18._attr = (xml_attribute_struct *)in_RAX;
      pxVar5 = (xml_attribute_struct *)
               impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this_00,0x28,(xml_memory_page **)&local_18);
    }
    if (pxVar5 == (xml_attribute_struct *)0x0) {
      pxVar5 = (xml_attribute_struct *)0x0;
    }
    else {
      pxVar5->prev_attribute_c = (xml_attribute_struct *)0x0;
      pxVar5->next_attribute = (xml_attribute_struct *)0x0;
      pxVar5->name = (char_t *)0x0;
      pxVar5->value = (char_t *)0x0;
      pxVar5->header = ((long)pxVar5 - (long)local_18._attr) * 0x100;
    }
    if (pxVar5 != (xml_attribute_struct *)0x0) {
      pxVar2 = this->_root;
      pxVar3 = pxVar2->first_attribute;
      pxVar4 = pxVar5;
      if (pxVar3 != (xml_attribute_struct *)0x0) {
        pxVar5->prev_attribute_c = pxVar3->prev_attribute_c;
        pxVar4 = pxVar3;
      }
      pxVar4->prev_attribute_c = pxVar5;
      pxVar5->next_attribute = pxVar3;
      pxVar2->first_attribute = pxVar5;
      local_18._attr = pxVar5;
      xml_attribute::set_name(&local_18,name_);
      return (xml_attribute)local_18._attr;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_attribute xml_node::prepend_attribute(const char_t* name_)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::prepend_attribute(a._attr, _root);

		a.set_name(name_);

		return a;
	}